

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

void __thiscall CppJieba::MPSegment::~MPSegment(MPSegment *this)

{
  Trie *in_RDI;
  
  in_RDI->_root = (TrieNode *)&PTR__MPSegment_0015ccb0;
  (*(code *)(in_RDI->_root->hmap)._M_h._M_element_count)();
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1]._nodeInfoVec.
              super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  Trie::~Trie(in_RDI);
  SegmentBase::~SegmentBase((SegmentBase *)0x1353de);
  return;
}

Assistant:

MPSegment(const char * const dictPath): _dictPath(dictPath){}